

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

shared_ptr<tchecker::clockbounds::local_lu_map_t> __thiscall
tchecker::clockbounds::clockbounds_t::local_lu_map(clockbounds_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tchecker::clockbounds::local_lu_map_t> sVar1;
  
  std::__shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2> *)this
             ,(__shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2> *)
              (in_RSI + 0x20));
  sVar1.super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<tchecker::clockbounds::local_lu_map_t>)
         sVar1.super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<tchecker::clockbounds::local_lu_map_t> clockbounds_t::local_lu_map() { return _local_lu; }